

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

Vec_Str_t *
Abc_NtkClpGiaOne(Gia_Man_t *p,int iCo,int nCubeLim,int nBTLimit,int fCanon,int fReverse,
                Vec_Int_t *vSupp,int fVerbose,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  int iVar1;
  Gia_Man_t *p_00;
  Vec_Str_t *vSop;
  long lVar2;
  int level;
  long lVar3;
  uint local_44;
  timespec local_40;
  
  local_44 = iCo;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p_00 = Gia_ManDupCones(p,(int *)&local_44,1,1);
  if (fVerbose != 0) {
    printf("Output %4d:  Supp = %4d. Cone =%6d.\n",(ulong)local_44,(ulong)(uint)vSupp->nSize,
           (ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs));
  }
  vSop = Bmc_CollapseOneOld(p_00,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose);
  Gia_ManStop(p_00);
  if (vSop != (Vec_Str_t *)0x0) {
    Abc_NtkCollapseReduce(vSop,vSupp,vClass,vSupps);
    if (fVerbose != 0) {
      printf("Supp new = %4d. Sop = %4d.  ",(ulong)(uint)vSupp->nSize,
             (long)vSop->nSize / (long)(int)(vSupp->nSize + 3) & 0xffffffff);
      level = 3;
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(level,"%s =","Time");
      Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
    }
  }
  return vSop;
}

Assistant:

Vec_Str_t * Abc_NtkClpGiaOne( Gia_Man_t * p, int iCo, int nCubeLim, int nBTLimit, int fCanon, int fReverse, Vec_Int_t * vSupp, int fVerbose, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    Vec_Str_t * vSop;
    abctime clk = Abc_Clock();
    extern Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    Gia_Man_t * pGia  = Gia_ManDupCones( p, &iCo, 1, 1 );
    if ( fVerbose )
        printf( "Output %4d:  Supp = %4d. Cone =%6d.\n", iCo, Vec_IntSize(vSupp), Gia_ManAndNum(pGia) );
    vSop = Bmc_CollapseOneOld( pGia, nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    Gia_ManStop( pGia );
    if ( vSop == NULL )
        return NULL;
    Abc_NtkCollapseReduce( vSop, vSupp, vClass, vSupps );
    if ( fVerbose )
        printf( "Supp new = %4d. Sop = %4d.  ", Vec_IntSize(vSupp), Vec_StrSize(vSop)/(Vec_IntSize(vSupp) +3) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vSop; 
}